

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Gia_Man_t * Acb_CreateMiter(Gia_Man_t *pF,Gia_Man_t *pG)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iLit1;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  
  Gia_ManFillValue(pF);
  Gia_ManFillValue(pG);
  p = Gia_ManStart(pF->nObjs * 2 + 1000);
  Gia_ManHashAlloc(p);
  pF->pObjs->Value = 0;
  pG->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < pF->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCi(pF,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p);
    pGVar4->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < pG->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCi(pG,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar5 = Gia_ManCi(pF,iVar7);
    pGVar4->Value = pGVar5->Value;
  }
  for (iVar7 = 0; iVar7 < pF->nObjs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManObj(pF,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iVar3 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManHashAnd(p,iVar2,iVar3);
      pGVar4->Value = uVar1;
    }
  }
  for (iVar7 = 0; iVar7 < pG->nObjs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManObj(pG,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iVar3 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManHashAnd(p,iVar2,iVar3);
      pGVar4->Value = uVar1;
    }
  }
  iVar7 = 0;
  for (iVar2 = 0; iVar2 < pG->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar4 = Gia_ManCo(pG,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjFanin0Copy(pGVar4);
    pGVar4 = Gia_ManCo(pF,iVar2);
    iLit1 = Gia_ObjFanin0Copy(pGVar4);
    iVar3 = Gia_ManHashXor(p,iVar3,iLit1);
    iVar7 = Gia_ManHashOr(p,iVar7,iVar3);
  }
  Gia_ManAppendCo(p,iVar7);
  for (iVar7 = 0; iVar7 < pF->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(pF,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (pG->vCos->nSize <= iVar7) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      Gia_ManAppendCo(p,iVar2);
    }
  }
  Gia_ManHashStop(p);
  pGVar6 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar6;
}

Assistant:

Gia_Man_t * Acb_CreateMiter( Gia_Man_t * pF, Gia_Man_t * pG )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i, iMiter = 0, iXor;
    Gia_ManFillValue( pF );
    Gia_ManFillValue( pG );
    pNew = Gia_ManStart( Gia_ManObjNum(pF) + Gia_ManObjNum(pF) + 1000 );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pF)->Value = 0;
    Gia_ManConst0(pG)->Value = 0;
    Gia_ManForEachCi( pF, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( pG, pObj, i )
        pObj->Value = Gia_ManCi(pF, i)->Value;
    Gia_ManForEachAnd( pF, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( pG, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pG, pObj, i )
    {
        iXor = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManCo(pF, i)) );
        iMiter = Gia_ManHashOr( pNew, iMiter, iXor );
    }
    Gia_ManAppendCo( pNew, iMiter );
    Gia_ManForEachCo( pF, pObj, i )
        if ( i >= Gia_ManCoNum(pG) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}